

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O3

Offsets google::protobuf::internal::AlignAndAddSizeDynamic
                  (size_t v,TypeKind kind,MessageLite *value_prototype_if_message,size_t *max_align)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  Offsets OVar5;
  
  switch(CONCAT71(in_register_00000031,kind) & 0xffffffff) {
  case 0:
    *max_align = *max_align + (ulong)(*max_align == 0);
    sVar2 = v + 1;
    break;
  case 1:
  case 3:
    uVar3 = 4;
    if (4 < *max_align) {
      uVar3 = *max_align;
    }
    *max_align = uVar3;
    v = v + 3 & 0xfffffffffffffffc;
    sVar2 = v + 4;
    break;
  case 2:
  case 4:
    uVar3 = 8;
    if (8 < *max_align) {
      uVar3 = *max_align;
    }
    *max_align = uVar3;
    v = v + 7 & 0xfffffffffffffff8;
    sVar2 = v + 8;
    break;
  case 5:
    uVar3 = 8;
    if (8 < *max_align) {
      uVar3 = *max_align;
    }
    *max_align = uVar3;
    v = v + 7 & 0xfffffffffffffff8;
    sVar2 = v + 0x20;
    break;
  case 6:
    iVar1 = (*value_prototype_if_message->_vptr_MessageLite[4])(value_prototype_if_message);
    uVar4 = (ulong)*(byte *)(CONCAT44(extraout_var,iVar1) + 0x2d);
    uVar3 = *max_align;
    if (*max_align <= uVar4) {
      uVar3 = uVar4;
    }
    *max_align = uVar3;
    uVar3 = (v + uVar4) - 1;
    v = uVar3 - uVar3 % uVar4;
    sVar2 = *(uint *)(CONCAT44(extraout_var,iVar1) + 0x28) + v;
    break;
  default:
    AlignAndAddSizeDynamic();
  }
  OVar5.end = sVar2;
  OVar5.start = v;
  return OVar5;
}

Assistant:

static Offsets AlignAndAddSizeDynamic(
    size_t v, UntypedMapBase::TypeKind kind,
    const MessageLite* value_prototype_if_message, size_t& max_align) {
  switch (kind) {
    case UntypedMapBase::TypeKind::kBool:
      return AlignAndAddSize<bool>(v, max_align);
    case UntypedMapBase::TypeKind::kU32:
      return AlignAndAddSize<int32_t>(v, max_align);
    case UntypedMapBase::TypeKind::kU64:
      return AlignAndAddSize<int64_t>(v, max_align);
    case UntypedMapBase::TypeKind::kFloat:
      return AlignAndAddSize<float>(v, max_align);
    case UntypedMapBase::TypeKind::kDouble:
      return AlignAndAddSize<double>(v, max_align);
    case UntypedMapBase::TypeKind::kString:
      return AlignAndAddSize<std::string>(v, max_align);
    case UntypedMapBase::TypeKind::kMessage: {
      auto* class_data = GetClassData(*value_prototype_if_message);
      v = AlignTo(v, class_data->alignment(), max_align);
      return {v, v + class_data->allocation_size()};
    }
    default:
      Unreachable();
  }
}